

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

BigInt * __thiscall BigInt::quick_pow(BigInt *__return_storage_ptr__,BigInt *this,int power)

{
  BigInt local_60;
  undefined1 local_40 [8];
  BigInt res;
  int power_local;
  BigInt *this_local;
  
  res.sign = power;
  if (power == 0) {
    BigInt(__return_storage_ptr__,1);
  }
  else {
    quick_pow((BigInt *)local_40,this,power / 2);
    if (res.sign % 2 == 0) {
      operator*(__return_storage_ptr__,(BigInt *)local_40,(BigInt *)local_40);
    }
    else {
      operator*(&local_60,(BigInt *)local_40,(BigInt *)local_40);
      operator*(__return_storage_ptr__,&local_60,this);
      ~BigInt(&local_60);
    }
    ~BigInt((BigInt *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::quick_pow(int power) {
    if (power == 0)
    {
        return BigInt(1);
    }
    BigInt res = quick_pow(power/2);
    if (power%2)
    {
        return res*res*(*this);
    }
    else
    {
        return res*res;
    }
}